

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

void helics::BrokerFactory::displayHelp(CoreType type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *psVar3;
  shared_ptr<helics::Broker> brk;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  long *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  if ((type == UNRECOGNIZED) || (type == DEFAULT)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All core types have similar options\n",0x24);
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    psVar3 = MasterBrokerBuilder::getDefaultBuilder();
    peVar1 = (psVar3->
             super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (**peVar1->_vptr_BrokerBuilder)(&local_58,peVar1,0,&local_38);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    (**(code **)(*local_58 + 0x40))(local_58,6,"--help");
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    psVar3 = MasterBrokerBuilder::getBuilder(0xb);
    peVar1 = (psVar3->
             super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (**peVar1->_vptr_BrokerBuilder)(&local_28,peVar1,0,&local_38);
    p_Var2 = p_Stack_20;
    local_58 = local_28;
    this = p_Stack_50;
    local_28 = (long *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_50 = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      }
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    (**(code **)(*local_58 + 0x40))(local_58,6,"--help");
  }
  else {
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    makeBroker((CoreType)&local_58,(string_view)ZEXT416(type));
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    (**(code **)(*local_58 + 0x40))(local_58,6,"--help");
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto brk = makeBroker(CoreType::DEFAULT, std::string{});
        brk->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        brk = makeBroker(CoreType::TCP_SS, std::string{});
        brk->configure(helpStr);
#endif
    } else {
        auto brk = makeBroker(type, std::string{});
        brk->configure(helpStr);
    }
}